

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O1

void highbd_bilinear_filter4xh
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  long lVar7;
  int iVar8;
  undefined2 uVar9;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  auVar10 = _DAT_00518190;
  if (xoffset == 0) {
    if (-1 < h) {
      lVar7 = 0;
      do {
        *(undefined8 *)(dst + lVar7 * 4) = *(undefined8 *)src;
        src = src + src_stride;
        lVar7 = lVar7 + 1;
      } while (h + 1 != (int)lVar7);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      lVar7 = 0;
      do {
        uVar9 = pavgw(src[1],*src);
        uVar11 = pavgw(src[2],src[1]);
        uVar12 = pavgw(src[3],src[2]);
        uVar13 = pavgw(src[4],src[3]);
        pavgw(src[5],src[4]);
        pavgw(src[6],src[5]);
        pavgw(src[7],src[6]);
        pavgw(0,src[7]);
        *(ulong *)(dst + lVar7 * 4) = CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar9)));
        src = src + src_stride;
        lVar7 = lVar7 + 1;
      } while (h + 1 != (int)lVar7);
    }
  }
  else {
    uVar5 = (uint)bilinear_filters_2t[xoffset][1] << 0x10 | (uint)bilinear_filters_2t[xoffset][0];
    auVar18._4_4_ = uVar5;
    auVar18._0_4_ = uVar5;
    auVar18._8_4_ = uVar5;
    auVar18._12_4_ = uVar5;
    pauVar6 = (undefined1 (*) [16])dst;
    if (0 < h) {
      iVar8 = 0;
      do {
        auVar20 = pshufb(*(undefined1 (*) [16])src,auVar10);
        auVar20 = pmaddwd(auVar20,auVar18);
        auVar21._0_4_ = auVar20._0_4_ + 0x40U >> 7;
        auVar21._4_4_ = auVar20._4_4_ + 0x40U >> 7;
        auVar21._8_4_ = auVar20._8_4_ + 0x40U >> 7;
        auVar21._12_4_ = auVar20._12_4_ + 0x40U >> 7;
        auVar20 = pshufb(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)src_stride * 2),
                         auVar10);
        auVar20 = pmaddwd(auVar20,auVar18);
        auVar27._0_4_ = auVar20._0_4_ + 0x40U >> 7;
        auVar27._4_4_ = auVar20._4_4_ + 0x40U >> 7;
        auVar27._8_4_ = auVar20._8_4_ + 0x40U >> 7;
        auVar27._12_4_ = auVar20._12_4_ + 0x40U >> 7;
        auVar20 = packssdw(auVar21,auVar27);
        *pauVar6 = auVar20;
        pauVar6 = pauVar6 + 1;
        iVar8 = iVar8 + 2;
        src = (uint16_t *)(*(undefined1 (*) [16])src + (long)(src_stride * 2) * 2);
      } while (iVar8 < h);
    }
    auVar10 = pshufb(*(undefined1 (*) [16])src,_DAT_00518190);
    auVar10 = pmaddwd(auVar10,auVar18);
    auVar20._0_4_ = auVar10._0_4_ + 0x40U >> 7;
    auVar20._4_4_ = auVar10._4_4_ + 0x40U >> 7;
    auVar20._8_4_ = auVar10._8_4_ + 0x40U >> 7;
    auVar20._12_4_ = auVar10._12_4_ + 0x40U >> 7;
    auVar10 = packssdw(auVar20,auVar20);
    *(long *)*pauVar6 = auVar10._0_8_;
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        lVar7 = 0;
        do {
          uVar1 = *(undefined8 *)(dst + lVar7 * 4);
          uVar2 = *(undefined8 *)(dst + lVar7 * 4 + 4);
          uVar9 = pavgw((short)uVar2,(short)uVar1);
          uVar11 = pavgw((short)((ulong)uVar2 >> 0x10),(short)((ulong)uVar1 >> 0x10));
          uVar12 = pavgw((short)((ulong)uVar2 >> 0x20),(short)((ulong)uVar1 >> 0x20));
          uVar13 = pavgw((short)((ulong)uVar2 >> 0x30),(short)((ulong)uVar1 >> 0x30));
          pavgw(0,0);
          pavgw(0,0);
          pavgw(0,0);
          pavgw(0,0);
          *(ulong *)(dst + lVar7 * 4) = CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar9)));
          lVar7 = lVar7 + 1;
        } while (h != (int)lVar7);
      }
    }
    else if (0 < h) {
      uVar5 = (uint)bilinear_filters_2t[yoffset][0] | (uint)bilinear_filters_2t[yoffset][1] << 0x10;
      auVar10._4_4_ = uVar5;
      auVar10._0_4_ = uVar5;
      auVar10._8_4_ = uVar5;
      auVar10._12_4_ = uVar5;
      lVar7 = 0;
      do {
        uVar3 = *(ulong *)(dst + lVar7 * 4);
        uVar4 = *(ulong *)(dst + lVar7 * 4 + 4);
        uVar1 = *(undefined8 *)(dst + lVar7 * 4 + 8);
        uVar12 = (undefined2)(uVar4 >> 0x30);
        auVar17._8_4_ = 0;
        auVar17._0_8_ = uVar3;
        auVar17._12_2_ = (short)(uVar3 >> 0x30);
        auVar17._14_2_ = uVar12;
        auVar16._12_4_ = auVar17._12_4_;
        auVar16._8_2_ = 0;
        auVar16._0_8_ = uVar3;
        uVar11 = (undefined2)(uVar4 >> 0x20);
        auVar16._10_2_ = uVar11;
        auVar15._10_6_ = auVar16._10_6_;
        auVar15._8_2_ = (short)(uVar3 >> 0x20);
        auVar15._0_8_ = uVar3;
        auVar14._8_8_ = auVar15._8_8_;
        uVar9 = (undefined2)(uVar4 >> 0x10);
        auVar14._6_2_ = uVar9;
        auVar14._4_2_ = (short)(uVar3 >> 0x10);
        auVar14._0_2_ = (undefined2)uVar3;
        auVar22._0_2_ = (undefined2)uVar4;
        auVar14._2_2_ = auVar22._0_2_;
        auVar18 = pmaddwd(auVar14,auVar10);
        auVar19._0_4_ = auVar18._0_4_ + 0x40U >> 7;
        auVar19._4_4_ = auVar18._4_4_ + 0x40U >> 7;
        auVar19._8_4_ = auVar18._8_4_ + 0x40U >> 7;
        auVar19._12_4_ = auVar18._12_4_ + 0x40U >> 7;
        auVar25._8_4_ = 0;
        auVar25._0_8_ = uVar4;
        auVar25._12_2_ = uVar12;
        auVar25._14_2_ = (short)((ulong)uVar1 >> 0x30);
        auVar24._12_4_ = auVar25._12_4_;
        auVar24._8_2_ = 0;
        auVar24._0_8_ = uVar4;
        auVar24._10_2_ = (short)((ulong)uVar1 >> 0x20);
        auVar23._10_6_ = auVar24._10_6_;
        auVar23._8_2_ = uVar11;
        auVar23._0_8_ = uVar4;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._6_2_ = (short)((ulong)uVar1 >> 0x10);
        auVar22._4_2_ = uVar9;
        auVar22._2_2_ = (short)uVar1;
        auVar18 = pmaddwd(auVar22,auVar10);
        auVar26._0_4_ = auVar18._0_4_ + 0x40U >> 7;
        auVar26._4_4_ = auVar18._4_4_ + 0x40U >> 7;
        auVar26._8_4_ = auVar18._8_4_ + 0x40U >> 7;
        auVar26._12_4_ = auVar18._12_4_ + 0x40U >> 7;
        auVar18 = packssdw(auVar19,auVar26);
        *(undefined1 (*) [16])(dst + lVar7 * 4) = auVar18;
        lVar7 = lVar7 + 2;
      } while ((int)lVar7 < h);
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter4xh(const uint16_t *src, int src_stride,
                                      int xoffset, int yoffset, uint16_t *dst,
                                      int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 2);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu16(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 2);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 2);
      const __m128i res =
          highbd_filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 8;
    }
    // Process i = h separately
    __m128i x = _mm_loadu_si128((__m128i *)src);
    __m128i z = _mm_srli_si128(x, 2);

    __m128i v0 = _mm_unpacklo_epi16(x, z);
    v0 = _mm_madd_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu32(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packs_epi32(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu16(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i res =
          highbd_filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 8;
    }
  }
}